

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O3

void __thiscall
Assimp::PretransformVertices::GetVFormatList
          (PretransformVertices *this,aiScene *pcScene,uint iMat,
          list<unsigned_int,_std::allocator<unsigned_int>_> *aiOut)

{
  size_t *psVar1;
  aiMesh *pcMesh;
  uint uVar2;
  ulong uVar3;
  _List_node_base *p_Var4;
  ulong uVar5;
  aiBone **ppaVar6;
  
  uVar3 = (ulong)pcScene->mNumMeshes;
  if (pcScene->mNumMeshes != 0) {
    uVar5 = 0;
    do {
      pcMesh = pcScene->mMeshes[uVar5];
      if (pcMesh->mMaterialIndex == iMat) {
        ppaVar6 = pcMesh->mBones;
        if (ppaVar6 == (aiBone **)0x0) {
          uVar2 = GetMeshVFormatUnique(pcMesh);
          ppaVar6 = (aiBone **)(ulong)uVar2;
          pcMesh->mBones = (aiBone **)(ulong)uVar2;
        }
        p_Var4 = (_List_node_base *)operator_new(0x18);
        *(int *)&p_Var4[1]._M_next = (int)ppaVar6;
        std::__detail::_List_node_base::_M_hook(p_Var4);
        psVar1 = &(aiOut->super__List_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 + 1;
        uVar3 = (ulong)pcScene->mNumMeshes;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar3);
  }
  return;
}

Assistant:

void PretransformVertices::GetVFormatList( aiScene* pcScene, unsigned int iMat,
    std::list<unsigned int>& aiOut)
{
    for (unsigned int i = 0; i < pcScene->mNumMeshes;++i)
    {
        aiMesh* pcMesh = pcScene->mMeshes[ i ];
        if (iMat == pcMesh->mMaterialIndex) {
            aiOut.push_back(GetMeshVFormat(pcMesh));
        }
    }
}